

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O1

vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> * __thiscall
spvtools::opt::MergeReturnPass::CollectReturnBlocks
          (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
           *__return_storage_ptr__,MergeReturnPass *this,Function *function)

{
  pointer puVar1;
  BasicBlock *pBVar2;
  Instruction *pIVar3;
  pointer puVar4;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = (function->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (function->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      pBVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      pIVar3 = *(Instruction **)
                ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      if ((pIVar3 == (Instruction *)0x0) ||
         ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
        __assert_fail("!insts_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                      ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
      }
      if ((*(Instruction **)
            ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18))->
          opcode_ - OpReturn < 2) {
        local_30._M_head_impl = pBVar2;
        std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
        emplace_back<spvtools::opt::BasicBlock*>
                  ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                   __return_storage_ptr__,&local_30._M_head_impl);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BasicBlock*> MergeReturnPass::CollectReturnBlocks(
    Function* function) {
  std::vector<BasicBlock*> return_blocks;
  for (auto& block : *function) {
    Instruction& terminator = *block.tail();
    if (terminator.opcode() == spv::Op::OpReturn ||
        terminator.opcode() == spv::Op::OpReturnValue) {
      return_blocks.push_back(&block);
    }
  }
  return return_blocks;
}